

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void LogicalANDExpression_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *v;
  undefined1 local_78 [8];
  JsValue r1;
  JsValue r3;
  JsValue r5;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_78);
  JsGetValue((JsValue *)local_78,res);
  JsToBoolean(res,(JsValue *)((long)&r1.u + 8));
  if (r3.type != JS_UNDEFINED) {
    v = (JsValue *)((long)&r3.u + 8);
    (*JsNodeClassEval[((JsAstNode *)na[1].location)->astClass])
              ((JsAstNode *)na[1].location,context,v);
    JsGetValue(v,res);
  }
  return;
}

Assistant:

static void
LogicalANDExpression_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r3, r5;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, res);
	JsToBoolean(res, &r3);
	if (r3.u.boolean == FALSE)
		return;
	EVAL(n->b, context, &r5);
	JsGetValue( &r5, res);
}